

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_InstantiateFunctionListItem2(JSContext *ctx,JSObject *p,JSAtom atom,void *opaque)

{
  uint len;
  long in_RCX;
  JSValue JVar1;
  JSCFunctionListEntry *e;
  JSValue val;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98 [16];
  JSValue in_stack_ffffffffffffffa8;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_10;
  undefined8 local_8;
  
  len = (uint)*(byte *)(in_RCX + 9);
  if (len == 0) {
    JVar1 = JS_NewCFunction2((JSContext *)in_stack_ffffffffffffffa8.tag,
                             (JSCFunction *)in_stack_ffffffffffffffa8.u.ptr,
                             in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._4_4_,
                             in_stack_ffffffffffffff98._0_4_,0);
    local_48 = JVar1.u;
    local_10 = local_48;
    local_40 = (JSContext *)JVar1.tag;
    local_8 = local_40;
  }
  else if (len == 3) {
    JVar1 = JS_NewAtomString((JSContext *)
                             (ulong)CONCAT14(*(byte *)(in_RCX + 9),in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
    local_10 = JVar1.u;
    local_8 = (JSContext *)JVar1.tag;
  }
  else {
    if (len != 8) {
      abort();
    }
    JVar1 = JS_NewObject((JSContext *)0x1564f9);
    local_10 = JVar1.u;
    local_8 = (JSContext *)JVar1.tag;
    JS_SetPropertyFunctionList
              (local_8,in_stack_ffffffffffffffa8,(JSCFunctionListEntry *)local_10,len);
  }
  JVar1.tag = (int64_t)local_8;
  JVar1.u.ptr = local_10;
  return JVar1;
}

Assistant:

static JSValue JS_InstantiateFunctionListItem2(JSContext *ctx, JSObject *p,
                                               JSAtom atom, void *opaque)
{
    const JSCFunctionListEntry *e = opaque;
    JSValue val;

    switch(e->def_type) {
    case JS_DEF_CFUNC:
        val = JS_NewCFunction2(ctx, e->u.func.cfunc.generic,
                               e->name, e->u.func.length, e->u.func.cproto, e->magic);
        break;
    case JS_DEF_PROP_STRING:
        val = JS_NewAtomString(ctx, e->u.str);
        break;
    case JS_DEF_OBJECT:
        val = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, val, e->u.prop_list.tab, e->u.prop_list.len);
        break;
    default:
        abort();
    }
    return val;
}